

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O0

bool __thiscall
HighsCutGeneration::finalizeAndAddCut
          (HighsCutGeneration *this,vector<int,_std::allocator<int>_> *inds_,
          vector<double,_std::allocator<double>_> *vals_,double *rhs_)

{
  bool bVar1;
  HighsInt HVar2;
  size_type sVar3;
  int *piVar4;
  double *pdVar5;
  pointer pHVar6;
  HighsSolution *pHVar7;
  double *in_RCX;
  HighsDomain *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  undefined8 *in_RDI;
  double dVar8;
  HighsInt cutindex;
  HighsInt i_1;
  vector<double,_std::allocator<double>_> *sol;
  HighsCDouble violation;
  HighsCutGeneration *in_stack_00000098;
  HighsInt i;
  double in_stack_000000d0;
  HighsInt in_stack_000000dc;
  double *in_stack_000000e0;
  HighsInt *in_stack_000000e8;
  HighsMipSolver *in_stack_000000f0;
  HighsCutPool *in_stack_000000f8;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  HighsInt in_stack_ffffffffffffff3c;
  HighsLpRelaxation *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  int local_5c;
  HighsCDouble local_50;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar9;
  undefined4 local_38;
  HighsInt in_stack_ffffffffffffffcc;
  double *in_stack_ffffffffffffffd0;
  bool local_1;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x5939b0);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  *(int *)((long)in_RDI + 0xe4) = (int)sVar3;
  piVar4 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x5939d8);
  in_RDI[0x19] = piVar4;
  pdVar5 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x5939f4);
  in_RDI[0x18] = pdVar5;
  HighsCDouble::HighsCDouble((HighsCDouble *)&local_38,*in_RCX);
  in_RDI[0x1a] = CONCAT44(in_stack_ffffffffffffffcc,local_38);
  in_RDI[0x1b] = in_stack_ffffffffffffffd0;
  *(undefined1 *)(in_RDI + 0x1c) = 1;
  *(undefined1 *)((long)in_RDI + 0xe1) = 0;
  iVar9 = *(int *)((long)in_RDI + 0xe4);
  while (iVar9 = iVar9 + -1, -1 < iVar9) {
    dVar8 = *(double *)(in_RDI[0x18] + (long)iVar9 * 8);
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      bVar1 = HighsLpRelaxation::isColIntegral(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      *(bool *)(in_RDI + 0x1c) = (*(byte *)(in_RDI + 0x1c) & 1 & bVar1) != 0;
    }
    else {
      *(int *)((long)in_RDI + 0xe4) = *(int *)((long)in_RDI + 0xe4) + -1;
      *(undefined4 *)(in_RDI[0x19] + (long)iVar9 * 4) =
           *(undefined4 *)(in_RDI[0x19] + (long)*(int *)((long)in_RDI + 0xe4) * 4);
      *(undefined8 *)(in_RDI[0x18] + (long)iVar9 * 8) =
           *(undefined8 *)(in_RDI[0x18] + (long)*(int *)((long)in_RDI + 0xe4) * 8);
    }
  }
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  HighsLpRelaxation::getMipSolver((HighsLpRelaxation *)*in_RDI);
  pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x593b9e);
  HighsDebugSol::checkCut
            ((HighsDebugSol *)&pHVar6->field_0x68b0,(HighsInt *)in_RDI[0x19],(double *)in_RDI[0x18],
             *(HighsInt *)((long)in_RDI + 0xe4),*in_RCX);
  bVar1 = postprocessCut(in_stack_00000098);
  if (bVar1) {
    dVar8 = HighsCDouble::operator_cast_to_double((HighsCDouble *)(in_RDI + 0x1a));
    *in_RCX = dVar8;
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48);
    HighsLpRelaxation::getMipSolver((HighsLpRelaxation *)*in_RDI);
    pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x593c58);
    piVar4 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x593c70);
    pdVar5 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x593c82);
    HighsDebugSol::checkCut
              ((HighsDebugSol *)&pHVar6->field_0x68b0,piVar4,pdVar5,
               *(HighsInt *)((long)in_RDI + 0xe4),*in_RCX);
    HighsCDouble::HighsCDouble(&local_50,-*in_RCX);
    pHVar7 = HighsLpRelaxation::getSolution((HighsLpRelaxation *)0x593ce8);
    for (local_5c = 0; local_5c != *(int *)((long)in_RDI + 0xe4); local_5c = local_5c + 1) {
      std::vector<double,_std::allocator<double>_>::operator[]
                (&pHVar7->col_value,(long)*(int *)(in_RDI[0x19] + (long)local_5c * 4));
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)in_RDX,(long)local_5c);
      HighsCDouble::operator+=
                ((HighsCDouble *)in_stack_ffffffffffffff40,
                 (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    bVar1 = HighsCDouble::operator<=
                      ((HighsCDouble *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                       ,(double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (bVar1) {
      local_1 = false;
    }
    else {
      HighsLpRelaxation::getMipSolver((HighsLpRelaxation *)*in_RDI);
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x593dc0);
      HighsDomain::tightenCoefficients
                (in_RDX,(HighsInt *)in_RCX,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                 (double *)CONCAT44(iVar9,in_stack_ffffffffffffffc0));
      HighsLpRelaxation::getMipSolver((HighsLpRelaxation *)*in_RDI);
      std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x593e18);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x593e2a);
      std::vector<int,_std::allocator<int>_>::size(in_RSI);
      HVar2 = HighsCutPool::addCut
                        (in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                         in_stack_000000dc,in_stack_000000d0,this._7_1_,this._6_1_,this._5_1_,
                         this._4_1_);
      local_1 = HVar2 != -1;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HighsCutGeneration::finalizeAndAddCut(std::vector<HighsInt>& inds_,
                                           std::vector<double>& vals_,
                                           double& rhs_) {
  complementation.clear();
  rowlen = inds_.size();
  inds = inds_.data();
  vals = vals_.data();
  rhs = rhs_;

  integralSupport = true;
  integralCoefficients = false;
  // remove zeros in place
  for (HighsInt i = rowlen - 1; i >= 0; --i) {
    if (vals[i] == 0.0) {
      --rowlen;
      inds[i] = inds[rowlen];
      vals[i] = vals[rowlen];
    } else {
      integralSupport &= lpRelaxation.isColIntegral(inds[i]);
    }
  }

  vals_.resize(rowlen);
  inds_.resize(rowlen);

  lpRelaxation.getMipSolver().mipdata_->debugSolution.checkCut(inds, vals,
                                                               rowlen, rhs_);
  // apply cut postprocessing including scaling and removal of small
  // coefficients
  if (!postprocessCut()) return false;
  rhs_ = (double)rhs;
  vals_.resize(rowlen);
  inds_.resize(rowlen);

  lpRelaxation.getMipSolver().mipdata_->debugSolution.checkCut(
      inds_.data(), vals_.data(), rowlen, rhs_);

  // finally determine the violation of the cut in the original space
  HighsCDouble violation = -rhs_;
  const auto& sol = lpRelaxation.getSolution().col_value;
  for (HighsInt i = 0; i != rowlen; ++i) violation += sol[inds[i]] * vals_[i];

  if (violation <= 10 * feastol) return false;

  lpRelaxation.getMipSolver().mipdata_->domain.tightenCoefficients(
      inds, vals, rowlen, rhs_);

  // if the cut is violated by a small factor above the feasibility
  // tolerance, add it to the cutpool
  HighsInt cutindex = cutpool.addCut(lpRelaxation.getMipSolver(), inds_.data(),
                                     vals_.data(), inds_.size(), rhs_,
                                     integralSupport && integralCoefficients);

  // only return true if cut was accepted by the cutpool, i.e. not a duplicate
  // of a cut already in the pool
  return cutindex != -1;
}